

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void add_history(CHAR_DATA *ch,CHAR_DATA *victim,char *string)

{
  undefined1 auVar1 [16];
  char *str;
  size_t sVar2;
  char *pcVar3;
  char buf [4608];
  char obuf [4608];
  char local_2428 [4608];
  char local_1228 [4608];
  
  str = ctime(&current_time);
  chomp(str);
  pcVar3 = victim->pcdata->history_buffer;
  if (pcVar3 == (char *)0x0) {
    local_2428[0] = '\0';
  }
  else {
    strcpy(local_2428,pcVar3);
  }
  if (ch == (CHAR_DATA *)0x0) {
    pcVar3 = "AUTO";
  }
  else {
    pcVar3 = ch->name;
  }
  auVar1 = SEXT816((victim->played + current_time) - victim->logon) * SEXT816(0x48d159e26af37c05);
  sprintf(local_1228,"Added by %s (%s at %d hours)\n\r",pcVar3,str,
          (ulong)(uint)((int)(auVar1._8_8_ >> 10) - (auVar1._12_4_ >> 0x1f)));
  strcat(local_2428,local_1228);
  strcat(local_2428,string);
  sVar2 = strlen(local_2428);
  (local_2428 + sVar2)[0] = '\n';
  (local_2428 + sVar2)[1] = '\r';
  local_2428[sVar2 + 2] = '\0';
  free_pstring(victim->pcdata->history_buffer);
  pcVar3 = palloc_string(local_2428);
  victim->pcdata->history_buffer = pcVar3;
  return;
}

Assistant:

void add_history(CHAR_DATA *ch, CHAR_DATA *victim, char *string)
{
	char buf[MAX_STRING_LENGTH];
	char obuf[MAX_STRING_LENGTH];
	char *strtime;

	strtime = ctime(&current_time);
	chomp(strtime);

	if (victim->pcdata->history_buffer)
		sprintf(buf, "%s", victim->pcdata->history_buffer);
	else
		strcpy(buf, "");

	sprintf(obuf, "Added by %s (%s at %d hours)\n\r",
		ch ? ch->name : "AUTO",
		strtime,
		(int)((victim->played + current_time - victim->logon) / 3600));

	strcat(buf, obuf);
	strcat(buf, string);
	strcat(buf, "\n\r");

	free_pstring(victim->pcdata->history_buffer);
	victim->pcdata->history_buffer = palloc_string(buf);
}